

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailedV
          (TypeChecker *this,Result result,char *desc,TypeVector *expected,bool is_end)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  char *types;
  string local_108;
  string local_e8;
  allocator<char> local_c1;
  string local_c0 [8];
  string message;
  Result result_1;
  Type type;
  size_t i;
  size_type sStack_80;
  bool incomplete_actual_stack;
  unsigned_long local_78;
  size_t kMaxActualStackToPrint;
  size_t actual_size;
  size_t max_depth;
  TypeVector actual;
  Label *local_40;
  Label *label;
  size_t limit;
  _anonymous_namespace_ *p_Stack_28;
  bool is_end_local;
  TypeVector *expected_local;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  limit._0_4_ = result.enum_;
  limit._7_1_ = is_end;
  p_Stack_28 = (_anonymous_namespace_ *)expected;
  expected_local = (TypeVector *)desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Succeeded(result);
  if (!bVar1) {
    label = (Label *)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = TopLabel(this,&local_40);
    bVar1 = Succeeded(actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    if (bVar1) {
      label = (Label *)local_40->type_stack_limit;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth);
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    actual_size = sVar3 - (long)label;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)p_Stack_28);
    if (sVar3 == 0) {
      local_78 = 4;
      puVar4 = std::min<unsigned_long>(&local_78,&actual_size);
      kMaxActualStackToPrint = *puVar4;
    }
    else {
      sStack_80 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)p_Stack_28);
      puVar4 = std::min<unsigned_long>(&stack0xffffffffffffff80,&actual_size);
      kMaxActualStackToPrint = *puVar4;
    }
    bVar1 = kMaxActualStackToPrint != actual_size;
    type.enum_ = Any;
    type.type_index_ = 0;
    for (; (ulong)type < kMaxActualStackToPrint; type = (Type)((long)type + 1)) {
      message.field_2._8_4_ =
           PeekType(this,((int)kMaxActualStackToPrint - type.enum_) - 1,
                    (Type *)&stack0xffffffffffffff68);
      message.field_2._12_4_ = message.field_2._8_4_;
      bVar2 = Succeeded((Result)message.field_2._8_4_);
      if (!bVar2) {
        __assert_fail("Succeeded(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/type-checker.cc"
                      ,0x186,
                      "void wabt::TypeChecker::PrintStackIfFailedV(Result, const char *, const TypeVector &, bool)"
                     );
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth,
                 (value_type *)&stack0xffffffffffffff68);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"type mismatch in ",&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    if ((limit._7_1_ & 1) != 0) {
      std::__cxx11::string::operator=(local_c0,"type mismatch at end of ");
    }
    std::__cxx11::string::operator+=(local_c0,(char *)expected_local);
    std::__cxx11::string::operator+=(local_c0,", expected ");
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_e8,p_Stack_28,(TypeVector *)0x0,(char *)expected);
    std::__cxx11::string::operator+=(local_c0,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::operator+=(local_c0," but got ");
    types = (char *)0x0;
    if (bVar1) {
      types = "... ";
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_108,(_anonymous_namespace_ *)&max_depth,(TypeVector *)types,
               (char *)CONCAT71((int7)((ulong)expected >> 8),bVar1));
    std::__cxx11::string::operator+=(local_c0,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    uVar5 = std::__cxx11::string::c_str();
    PrintError(this,"%s",uVar5);
    std::__cxx11::string::~string(local_c0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&max_depth);
  }
  return;
}

Assistant:

void TypeChecker::PrintStackIfFailedV(Result result,
                                      const char* desc,
                                      const TypeVector& expected,
                                      bool is_end) {
  if (Succeeded(result)) {
    return;
  }

  size_t limit = 0;
  Label* label;
  if (Succeeded(TopLabel(&label))) {
    limit = label->type_stack_limit;
  }

  TypeVector actual;
  size_t max_depth = type_stack_.size() - limit;

  // In general we want to print as many values of the actual stack as were
  // expected. However, if the stack was expected to be empty, we should
  // print some amount of the actual stack.
  size_t actual_size;
  if (expected.size() == 0) {
    // Don't print too many elements if the stack is really deep.
    const size_t kMaxActualStackToPrint = 4;
    actual_size = std::min(kMaxActualStackToPrint, max_depth);
  } else {
    actual_size = std::min(expected.size(), max_depth);
  }

  bool incomplete_actual_stack = actual_size != max_depth;

  for (size_t i = 0; i < actual_size; ++i) {
    Type type;
    Result result = PeekType(actual_size - i - 1, &type);
    WABT_USE(result);
    assert(Succeeded(result));
    actual.push_back(type);
  }

  std::string message = "type mismatch in ";
  if (is_end) {
    message = "type mismatch at end of ";
  }
  message += desc;
  message += ", expected ";
  message += TypesToString(expected);
  message += " but got ";
  message += TypesToString(actual, incomplete_actual_stack ? "... " : nullptr);

  PrintError("%s", message.c_str());
}